

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O3

void __thiscall
ObserverManager_SharedPtr_Test::~ObserverManager_SharedPtr_Test
          (ObserverManager_SharedPtr_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ObserverManager, SharedPtr)  {
    std::stringstream out;

    auto a = std::make_shared<A>(out, "Tic");
    ObserverManager::subscribe<FooBarProtocol>(a);

    auto b = std::make_shared<B>(out);
    ObserverManager::subscribe<FooBarProtocol>(b);
    
    ObserverManager::notify(&FooBarProtocol::foo);

    ObserverManager::unsubscribe<FooBarProtocol>(b);

    ObserverManager::notify(&FooBarProtocol::bar, "Tac");
    
    EXPECT_EQ("Tic Tac ", out.str());
}